

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  char *__s;
  ulong uVar1;
  ostream *poVar2;
  GTestLog local_30 [5];
  allocator<char> local_19;
  char *local_18;
  char *output_file_local;
  XmlUnitTestResultPrinter *this_local;
  
  local_18 = output_file;
  output_file_local = (char *)this;
  EmptyTestEventListener::EmptyTestEventListener(&this->super_EmptyTestEventListener);
  __s = local_18;
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__XmlUnitTestResultPrinter_001a69a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->output_file_,__s,&local_19);
  std::allocator<char>::~allocator(&local_19);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    GTestLog::GTestLog(local_30,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/anatoly-spb[P]cmake-googletest-example/thirdparty/googletest/googletest/src/gtest.cc"
                       ,0xf81);
    poVar2 = GTestLog::GetStream(local_30);
    std::operator<<(poVar2,"XML output file may not be null");
    GTestLog::~GTestLog(local_30);
  }
  return;
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.empty()) {
    GTEST_LOG_(FATAL) << "XML output file may not be null";
  }
}